

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void page_ref(Page *pPage)

{
  SyMutexMethods *pSVar1;
  SyMemBackend *pSVar2;
  
  pSVar2 = pPage->pPager->pAllocator;
  pSVar1 = pSVar2->pMutexMethods;
  if (pSVar1 == (SyMutexMethods *)0x0) {
    pPage->nRef = pPage->nRef + 1;
  }
  else {
    if (pSVar2->pMutex == (SyMutex *)0x0) {
      pPage->nRef = pPage->nRef + 1;
    }
    else {
      (*pSVar1->xEnter)(pSVar2->pMutex);
      pSVar2 = pPage->pPager->pAllocator;
      pSVar1 = pSVar2->pMutexMethods;
      pPage->nRef = pPage->nRef + 1;
      if (pSVar1 == (SyMutexMethods *)0x0) {
        return;
      }
    }
    if (pSVar2->pMutex != (SyMutex *)0x0) {
      (*pSVar1->xLeave)(pSVar2->pMutex);
      return;
    }
  }
  return;
}

Assistant:

static void page_ref(Page *pPage)
{
	if( pPage->pPager->pAllocator->pMutexMethods ){
		SyMutexEnter(pPage->pPager->pAllocator->pMutexMethods, pPage->pPager->pAllocator->pMutex);
	}
	pPage->nRef++;
	if( pPage->pPager->pAllocator->pMutexMethods ){
		SyMutexLeave(pPage->pPager->pAllocator->pMutexMethods, pPage->pPager->pAllocator->pMutex);
	}
}